

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_copySequencesToSeqStoreNoBlockDelim
                 (ZSTD_CCtx *cctx,ZSTD_sequencePosition *seqPos,ZSTD_Sequence *inSeqs,
                 size_t inSeqsSize,void *src,size_t blockSize,ZSTD_paramSwitch_e externalRepSearch)

{
  BYTE **ppBVar1;
  BYTE *pBVar2;
  uint uVar3;
  ZSTD_CDict *pZVar4;
  ZSTD_compressedBlockState_t *pZVar5;
  BYTE *pBVar6;
  seqDef *psVar7;
  undefined8 uVar8;
  ZSTD_sequencePosition *pZVar9;
  U32 UVar10;
  U32 offCode;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  uint uVar16;
  U32 UVar17;
  long lVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  BYTE *pBVar24;
  uint uVar25;
  uint uVar26;
  repcodes_t updatedRepcodes;
  uint local_bc;
  undefined8 local_b8;
  U32 local_b0;
  U32 local_a8;
  uint local_a4;
  U32 local_a0;
  int local_9c;
  uint local_98;
  uint local_94;
  ulong local_90;
  ZSTD_sequencePosition *local_88;
  ulong local_80;
  uint local_74;
  size_t local_70;
  ulong local_68;
  ZSTD_Sequence *local_60;
  ulong local_58;
  ZSTD_CCtx *local_50;
  BYTE *local_48;
  BYTE *local_40;
  BYTE *local_38;
  
  uVar26 = (int)blockSize + seqPos->posInSequence;
  pZVar4 = cctx->cdict;
  if (pZVar4 == (ZSTD_CDict *)0x0) {
    if ((cctx->prefixDict).dict == (void *)0x0) {
      local_70 = 0;
      goto LAB_001bb2e3;
    }
    pZVar4 = (ZSTD_CDict *)&cctx->prefixDict;
  }
  local_70 = pZVar4->dictContentSize;
LAB_001bb2e3:
  uVar20 = seqPos->idx;
  pBVar24 = (BYTE *)((long)src + blockSize);
  pZVar5 = (cctx->blockState).prevCBlock;
  local_b0 = pZVar5->rep[2];
  local_b8 = *(ulong *)pZVar5->rep;
  local_88 = seqPos;
  local_68 = blockSize;
  local_60 = inSeqs;
  local_58 = inSeqsSize;
  if (uVar26 == 0) {
    uVar11 = 0;
    uVar13 = 0;
  }
  else {
    local_90 = local_b8 & 0xffffffff;
    local_b8._4_4_ = (U32)(local_b8 >> 0x20);
    local_a8 = local_b8._4_4_;
    local_40 = pBVar24 + -0x20;
    local_bc = 0;
    uVar19 = (ulong)seqPos->posInSequence;
    iVar23 = 0;
    local_a0 = local_b0;
    local_50 = cctx;
    local_38 = pBVar24;
    do {
      uVar11 = uVar26;
      uVar13 = local_bc;
      if ((iVar23 != 0) || (uVar14 = (ulong)uVar20, local_58 <= uVar14)) goto LAB_001bb763;
      uVar3 = local_60[uVar14].litLength;
      uVar21 = local_60[uVar14].matchLength;
      local_94 = uVar3 + uVar21;
      uVar16 = local_94 - uVar26;
      uVar22 = (uint)uVar19;
      if (local_94 < uVar26 || uVar16 == 0) {
        uVar25 = uVar3 - uVar22;
        if (uVar3 < uVar22) {
          uVar25 = 0;
        }
        iVar23 = uVar22 - uVar3;
        local_9c = 0;
        if (uVar22 < uVar3) {
          iVar23 = 0;
        }
        uVar21 = uVar21 - iVar23;
        local_80 = 0;
        local_a4 = local_94;
      }
      else {
        uVar12 = uVar26 - uVar3;
        if (uVar26 < uVar3 || uVar12 == 0) goto LAB_001bb763;
        uVar25 = uVar3 - uVar22;
        if (uVar3 < uVar22) {
          uVar25 = 0;
        }
        uVar11 = uVar3;
        uVar13 = uVar12;
        if (uVar21 <= local_68) goto LAB_001bb763;
        uVar21 = (uVar26 - uVar22) - uVar25;
        uVar3 = (cctx->appliedParams).cParams.minMatch;
        if (uVar21 < uVar3) goto LAB_001bb763;
        local_a4 = uVar3 - uVar16;
        if (uVar3 >= uVar16 && local_a4 != 0) {
          local_bc = local_a4;
        }
        if (uVar3 < uVar16) {
          local_a4 = 0;
        }
        uVar21 = uVar21 - local_a4;
        local_9c = 1;
        local_80 = uVar19;
      }
      offCode = ZSTD_finalizeOffBase(local_60[uVar14].offset,(U32 *)&local_b8,(uint)(uVar25 == 0));
      pZVar9 = local_88;
      local_74 = uVar20;
      local_98 = uVar26;
      UVar17 = (U32)local_90;
      if (offCode < 4) {
        if (offCode == 0) {
          __assert_fail("OFFBASE_IS_REPCODE(offBase)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2d5,"void ZSTD_updateRep(U32 *, const U32, const U32)");
        }
        uVar26 = offCode - (uVar25 != 0);
        UVar10 = local_a8;
        if (uVar26 != 0) {
          if (uVar26 == 3) {
            uVar20 = UVar17 - 1;
          }
          else {
            uVar20 = *(uint *)((long)&local_b8 + (ulong)uVar26 * 4);
          }
          if (uVar26 == 1) {
            local_a8 = local_a0;
          }
          goto LAB_001bb4a3;
        }
      }
      else {
        uVar20 = offCode - 3;
LAB_001bb4a3:
        local_90 = (ulong)uVar20;
        local_b8 = CONCAT44(UVar17,uVar20);
        local_b0 = local_a8;
        UVar10 = UVar17;
        local_a0 = local_a8;
      }
      local_a8 = UVar10;
      if ((cctx->appliedParams).validateSequences != 0) {
        sVar15 = (ulong)(uVar25 + uVar21) + local_88->posInSrc;
        local_88->posInSrc = sVar15;
        sVar15 = ZSTD_validateSequence
                           (offCode,uVar21,(cctx->appliedParams).cParams.minMatch,sVar15,
                            (cctx->appliedParams).cParams.windowLog,local_70,
                            (cctx->appliedParams).useSequenceProducer);
        if (0xffffffffffffff88 < sVar15) {
          return sVar15;
        }
      }
      pBVar24 = local_38;
      uVar20 = local_74;
      uVar19 = (cctx->seqStore).maxNbSeq;
      if (uVar19 <= local_74 - pZVar9->idx) {
        return 0xffffffffffffff95;
      }
      if (uVar19 <= (ulong)((long)(cctx->seqStore).sequences - (long)(cctx->seqStore).sequencesStart
                           >> 3)) {
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar19 = (cctx->seqStore).maxNbLit;
      if (0x20000 < uVar19) {
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x29f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar14 = (ulong)uVar25;
      pBVar6 = (cctx->seqStore).lit;
      if ((cctx->seqStore).litStart + uVar19 < pBVar6 + uVar14) {
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a0,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      pBVar2 = (BYTE *)((long)src + uVar14);
      if (local_38 < pBVar2) {
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2a1,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (local_40 < pBVar2) {
        local_48 = (BYTE *)src;
        ZSTD_safecopyLiterals(pBVar6,(BYTE *)src,pBVar2,local_40);
        src = local_48;
        cctx = local_50;
LAB_001bb5c8:
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar14;
        if (0xffff < uVar25) {
          if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                          ,0x2b2,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          (cctx->seqStore).longLengthType = ZSTD_llt_literalLength;
          (cctx->seqStore).longLengthPos =
               (U32)((ulong)((long)(cctx->seqStore).sequences -
                            (long)(cctx->seqStore).sequencesStart) >> 3);
        }
      }
      else {
        uVar8 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar6 = *src;
        *(undefined8 *)(pBVar6 + 8) = uVar8;
        if (0x10 < uVar25) {
          pBVar6 = (cctx->seqStore).lit;
          if ((BYTE *)0xffffffffffffffe0 < pBVar6 + 0x10 + (-0x10 - ((long)src + 0x10))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                          ,0xe9,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar8 = *(undefined8 *)((long)src + 0x18);
          *(undefined8 *)(pBVar6 + 0x10) = *(undefined8 *)((long)src + 0x10);
          *(undefined8 *)(pBVar6 + 0x18) = uVar8;
          if (0x10 < uVar14 - 0x10) {
            lVar18 = 0;
            do {
              uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar18 + 0x20) + 8);
              pBVar2 = pBVar6 + lVar18 + 0x20;
              *(undefined8 *)pBVar2 = *(undefined8 *)((long)src + lVar18 + 0x20);
              *(undefined8 *)(pBVar2 + 8) = uVar8;
              uVar8 = *(undefined8 *)((BYTE *)((long)src + lVar18 + 0x30) + 8);
              *(undefined8 *)(pBVar2 + 0x10) = *(undefined8 *)((long)src + lVar18 + 0x30);
              *(undefined8 *)(pBVar2 + 0x18) = uVar8;
              lVar18 = lVar18 + 0x20;
            } while (pBVar2 + 0x20 < pBVar6 + uVar14);
            goto LAB_001bb5c8;
          }
        }
        ppBVar1 = &(cctx->seqStore).lit;
        *ppBVar1 = *ppBVar1 + uVar14;
      }
      psVar7 = (cctx->seqStore).sequences;
      psVar7->litLength = (U16)uVar25;
      psVar7->offBase = offCode;
      if (uVar21 < 3) {
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,700,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < (ulong)uVar21 - 3) {
        if ((cctx->seqStore).longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x2bf,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        (cctx->seqStore).longLengthType = ZSTD_llt_matchLength;
        (cctx->seqStore).longLengthPos =
             (U32)((ulong)((long)psVar7 - (long)(cctx->seqStore).sequencesStart) >> 3);
      }
      uVar26 = local_98 - local_a4;
      src = (void *)((long)src + (ulong)(uVar21 + uVar25));
      psVar7->mlBase = (U16)((ulong)uVar21 - 3);
      (cctx->seqStore).sequences = psVar7 + 1;
      uVar20 = (uVar20 + 1) - (uint)(local_98 < local_94);
      uVar19 = local_80;
      iVar23 = local_9c;
    } while (uVar26 != 0);
    uVar11 = 0;
    uVar13 = local_bc;
  }
LAB_001bb763:
  uVar19 = (ulong)uVar20;
  if ((uVar19 != local_58) && (local_60[uVar19].matchLength + local_60[uVar19].litLength < uVar11))
  {
    __assert_fail("idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                  ,0x19b7,
                  "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                 );
  }
  local_88->idx = uVar20;
  local_88->posInSequence = uVar11;
  pZVar5 = (cctx->blockState).nextCBlock;
  pZVar5->rep[2] = local_b0;
  *(ulong *)pZVar5->rep = local_b8;
  pBVar24 = pBVar24 + -(ulong)uVar13;
  if ((BYTE *)src != pBVar24) {
    if (pBVar24 < src) {
      __assert_fail("ip <= iend",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x19c0,
                    "size_t ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx *, ZSTD_sequencePosition *, const ZSTD_Sequence *const, size_t, const void *, size_t, ZSTD_paramSwitch_e)"
                   );
    }
    uVar19 = (ulong)(uint)((int)pBVar24 - (int)src);
    memcpy((cctx->seqStore).lit,src,uVar19);
    ppBVar1 = &(cctx->seqStore).lit;
    *ppBVar1 = *ppBVar1 + uVar19;
    local_88->posInSrc = local_88->posInSrc + uVar19;
  }
  return (ulong)uVar13;
}

Assistant:

size_t
ZSTD_copySequencesToSeqStoreNoBlockDelim(ZSTD_CCtx* cctx, ZSTD_sequencePosition* seqPos,
                                   const ZSTD_Sequence* const inSeqs, size_t inSeqsSize,
                                   const void* src, size_t blockSize, ZSTD_paramSwitch_e externalRepSearch)
{
    U32 idx = seqPos->idx;
    U32 startPosInSequence = seqPos->posInSequence;
    U32 endPosInSequence = seqPos->posInSequence + (U32)blockSize;
    size_t dictSize;
    BYTE const* ip = (BYTE const*)(src);
    BYTE const* iend = ip + blockSize;  /* May be adjusted if we decide to process fewer than blockSize bytes */
    repcodes_t updatedRepcodes;
    U32 bytesAdjustment = 0;
    U32 finalMatchSplit = 0;

    /* TODO(embg) support fast parsing mode in noBlockDelim mode */
    (void)externalRepSearch;

    if (cctx->cdict) {
        dictSize = cctx->cdict->dictContentSize;
    } else if (cctx->prefixDict.dict) {
        dictSize = cctx->prefixDict.dictSize;
    } else {
        dictSize = 0;
    }
    DEBUGLOG(5, "ZSTD_copySequencesToSeqStoreNoBlockDelim: idx: %u PIS: %u blockSize: %zu", idx, startPosInSequence, blockSize);
    DEBUGLOG(5, "Start seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    ZSTD_memcpy(updatedRepcodes.rep, cctx->blockState.prevCBlock->rep, sizeof(repcodes_t));
    while (endPosInSequence && idx < inSeqsSize && !finalMatchSplit) {
        const ZSTD_Sequence currSeq = inSeqs[idx];
        U32 litLength = currSeq.litLength;
        U32 matchLength = currSeq.matchLength;
        U32 const rawOffset = currSeq.offset;
        U32 offBase;

        /* Modify the sequence depending on where endPosInSequence lies */
        if (endPosInSequence >= currSeq.litLength + currSeq.matchLength) {
            if (startPosInSequence >= litLength) {
                startPosInSequence -= litLength;
                litLength = 0;
                matchLength -= startPosInSequence;
            } else {
                litLength -= startPosInSequence;
            }
            /* Move to the next sequence */
            endPosInSequence -= currSeq.litLength + currSeq.matchLength;
            startPosInSequence = 0;
        } else {
            /* This is the final (partial) sequence we're adding from inSeqs, and endPosInSequence
               does not reach the end of the match. So, we have to split the sequence */
            DEBUGLOG(6, "Require a split: diff: %u, idx: %u PIS: %u",
                     currSeq.litLength + currSeq.matchLength - endPosInSequence, idx, endPosInSequence);
            if (endPosInSequence > litLength) {
                U32 firstHalfMatchLength;
                litLength = startPosInSequence >= litLength ? 0 : litLength - startPosInSequence;
                firstHalfMatchLength = endPosInSequence - startPosInSequence - litLength;
                if (matchLength > blockSize && firstHalfMatchLength >= cctx->appliedParams.cParams.minMatch) {
                    /* Only ever split the match if it is larger than the block size */
                    U32 secondHalfMatchLength = currSeq.matchLength + currSeq.litLength - endPosInSequence;
                    if (secondHalfMatchLength < cctx->appliedParams.cParams.minMatch) {
                        /* Move the endPosInSequence backward so that it creates match of minMatch length */
                        endPosInSequence -= cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        bytesAdjustment = cctx->appliedParams.cParams.minMatch - secondHalfMatchLength;
                        firstHalfMatchLength -= bytesAdjustment;
                    }
                    matchLength = firstHalfMatchLength;
                    /* Flag that we split the last match - after storing the sequence, exit the loop,
                       but keep the value of endPosInSequence */
                    finalMatchSplit = 1;
                } else {
                    /* Move the position in sequence backwards so that we don't split match, and break to store
                     * the last literals. We use the original currSeq.litLength as a marker for where endPosInSequence
                     * should go. We prefer to do this whenever it is not necessary to split the match, or if doing so
                     * would cause the first half of the match to be too small
                     */
                    bytesAdjustment = endPosInSequence - currSeq.litLength;
                    endPosInSequence = currSeq.litLength;
                    break;
                }
            } else {
                /* This sequence ends inside the literals, break to store the last literals */
                break;
            }
        }
        /* Check if this offset can be represented with a repcode */
        {   U32 const ll0 = (litLength == 0);
            offBase = ZSTD_finalizeOffBase(rawOffset, updatedRepcodes.rep, ll0);
            ZSTD_updateRep(updatedRepcodes.rep, offBase, ll0);
        }

        if (cctx->appliedParams.validateSequences) {
            seqPos->posInSrc += litLength + matchLength;
            FORWARD_IF_ERROR(ZSTD_validateSequence(offBase, matchLength, cctx->appliedParams.cParams.minMatch, seqPos->posInSrc,
                                                   cctx->appliedParams.cParams.windowLog, dictSize, cctx->appliedParams.useSequenceProducer),
                                                   "Sequence validation failed");
        }
        DEBUGLOG(6, "Storing sequence: (of: %u, ml: %u, ll: %u)", offBase, matchLength, litLength);
        RETURN_ERROR_IF(idx - seqPos->idx >= cctx->seqStore.maxNbSeq, externalSequences_invalid,
                        "Not enough memory allocated. Try adjusting ZSTD_c_minMatch.");
        ZSTD_storeSeq(&cctx->seqStore, litLength, ip, iend, offBase, matchLength);
        ip += matchLength + litLength;
        if (!finalMatchSplit)
            idx++; /* Next Sequence */
    }
    DEBUGLOG(5, "Ending seq: idx: %u (of: %u ml: %u ll: %u)", idx, inSeqs[idx].offset, inSeqs[idx].matchLength, inSeqs[idx].litLength);
    assert(idx == inSeqsSize || endPosInSequence <= inSeqs[idx].litLength + inSeqs[idx].matchLength);
    seqPos->idx = idx;
    seqPos->posInSequence = endPosInSequence;
    ZSTD_memcpy(cctx->blockState.nextCBlock->rep, updatedRepcodes.rep, sizeof(repcodes_t));

    iend -= bytesAdjustment;
    if (ip != iend) {
        /* Store any last literals */
        U32 lastLLSize = (U32)(iend - ip);
        assert(ip <= iend);
        DEBUGLOG(6, "Storing last literals of size: %u", lastLLSize);
        ZSTD_storeLastLiterals(&cctx->seqStore, ip, lastLLSize);
        seqPos->posInSrc += lastLLSize;
    }

    return bytesAdjustment;
}